

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O3

void ncnn::convdw3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  undefined1 auVar14 [32];
  long lVar15;
  uint *puVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong *puVar21;
  float *pfVar22;
  float *pfVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  iVar5 = bottom_blob->c;
  if (0 < (long)iVar5) {
    iVar6 = top_blob->w;
    uVar7 = top_blob->h;
    lVar27 = (long)bottom_blob->w;
    sVar8 = top_blob->cstep;
    sVar9 = top_blob->elemsize;
    pvVar10 = top_blob->data;
    sVar11 = bottom_blob->cstep;
    sVar12 = bottom_blob->elemsize;
    pvVar13 = bottom_blob->data;
    lVar1 = lVar27 + 2;
    lVar20 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar29 = 0.0;
      }
      else {
        fVar29 = *(float *)((long)&_bias->data + lVar20 * 4);
      }
      pfVar22 = (float *)(sVar8 * sVar9 * lVar20 + (long)pvVar10);
      puVar17 = (ulong *)(sVar11 * sVar12 * lVar20 + (long)pvVar13);
      lVar15 = lVar20 * 0x24;
      puVar16 = (uint *)((long)puVar17 + lVar27 * 4);
      puVar21 = puVar17 + lVar27;
      pfVar23 = pfVar22;
      uVar24 = 0;
      if (1 < (int)uVar7) {
        lVar19 = (long)puVar17 + lVar27 * 0xc;
        iVar25 = 0;
        do {
          pfVar22 = pfVar22 + iVar6;
          if (0 < iVar6) {
            lVar28 = 0;
            uVar24 = iVar6 + 1U;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)((long)puVar17 + lVar28 + 4);
              auVar32 = vmovlhps_avx(ZEXT416(*(uint *)((long)puVar17 + lVar28)),auVar30);
              auVar32 = vshufps_avx(auVar32,auVar30,0xd8);
              auVar33 = vinsertps_avx(auVar32,ZEXT416((uint)*(float *)((long)puVar16 + lVar28)),0x30
                                     );
              pfVar2 = (float *)((long)&_kernel->elemsize + lVar15);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)puVar16 + lVar28 + 4);
              auVar32 = vinsertps_avx(auVar38,ZEXT416(*(uint *)((long)puVar21 + lVar28)),0x20);
              auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)((long)puVar21 + lVar28 + 4)),0x30);
              auVar40._0_4_ = *pfVar2 * auVar32._0_4_;
              auVar40._4_4_ = pfVar2[1] * auVar32._4_4_;
              auVar40._8_4_ = pfVar2[2] * auVar32._8_4_;
              auVar40._12_4_ = pfVar2[3] * auVar32._12_4_;
              auVar30 = vhaddps_avx(auVar40,auVar40);
              auVar32 = *(undefined1 (*) [16])((long)&_kernel->data + lVar15);
              auVar30 = vhaddps_avx(auVar30,auVar30);
              auVar35._0_4_ = auVar32._0_4_ * auVar33._0_4_;
              auVar35._4_4_ = auVar32._4_4_ * auVar33._4_4_;
              auVar35._8_4_ = auVar32._8_4_ * auVar33._8_4_;
              auVar35._12_4_ = auVar32._12_4_ * auVar33._12_4_;
              auVar33 = vhaddps_avx(auVar35,auVar35);
              fVar3 = *(float *)((long)&_kernel->allocator + lVar15);
              auVar33 = vhaddps_avx(auVar33,auVar33);
              auVar35 = vmovlhps_avx(auVar32,auVar38);
              auVar35 = vshufps_avx(auVar35,auVar38,0xd8);
              auVar38 = vinsertps_avx(auVar35,ZEXT416(*(uint *)((long)puVar21 + lVar28)),0x30);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)((long)puVar21 + lVar28 + 4);
              auVar35 = vmovhps_avx(auVar39,*(undefined8 *)(lVar19 + lVar28));
              fVar4 = *(float *)(lVar19 + 8 + lVar28);
              auVar37._0_4_ = auVar35._0_4_ * *pfVar2;
              auVar37._4_4_ = auVar35._4_4_ * pfVar2[1];
              auVar37._8_4_ = auVar35._8_4_ * pfVar2[2];
              auVar37._12_4_ = auVar35._12_4_ * pfVar2[3];
              auVar35 = vhaddps_avx(auVar37,auVar37);
              auVar35 = vhaddps_avx(auVar35,auVar35);
              auVar31._0_4_ = auVar38._0_4_ * *(float *)((long)puVar16 + lVar28);
              auVar31._4_4_ = auVar38._4_4_ * auVar32._4_4_;
              auVar31._8_4_ = auVar38._8_4_ * auVar32._8_4_;
              auVar31._12_4_ = auVar38._12_4_ * auVar32._12_4_;
              auVar32 = vhaddps_avx(auVar31,auVar31);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              *(float *)((long)pfVar23 + lVar28) =
                   auVar30._0_4_ +
                   fVar3 * *(float *)((long)puVar21 + lVar28 + 8) + auVar33._0_4_ + fVar29;
              *(float *)((long)pfVar22 + lVar28) =
                   fVar3 * fVar4 + auVar35._0_4_ + auVar32._0_4_ + fVar29;
              lVar28 = lVar28 + 4;
              uVar24 = uVar24 - 1;
            } while (1 < uVar24);
            pfVar23 = (float *)((long)pfVar23 + lVar28);
            pfVar22 = (float *)((long)pfVar22 + lVar28);
            puVar17 = (ulong *)((long)puVar17 + lVar28);
            puVar16 = (uint *)((long)puVar16 + lVar28);
            puVar21 = (ulong *)((long)puVar21 + lVar28);
            lVar19 = lVar19 + lVar28;
          }
          puVar17 = (ulong *)((long)puVar17 + lVar1 * 4);
          puVar16 = puVar16 + lVar1;
          puVar21 = (ulong *)((long)puVar21 + lVar1 * 4);
          lVar19 = lVar19 + lVar1 * 4;
          pfVar23 = pfVar23 + iVar6;
          iVar26 = iVar25 + 3;
          iVar25 = iVar25 + 2;
          uVar24 = uVar7 & 0xfffffffe;
        } while (iVar26 < (int)uVar7);
      }
      if ((int)uVar24 < (int)uVar7) {
        do {
          uVar18 = iVar6 + 1U;
          if (0 < iVar6) {
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *puVar17;
              auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)puVar17[1]),0x20);
              auVar32 = vinsertps_avx(auVar32,ZEXT416(*puVar16),0x30);
              auVar36._16_8_ = *(undefined8 *)(puVar16 + 1);
              auVar36._0_16_ = auVar32;
              auVar36._24_8_ = 0;
              auVar34._16_8_ = *puVar21;
              auVar34._0_16_ = auVar32;
              auVar34._24_8_ = 0;
              auVar34 = vshufpd_avx(auVar36,auVar34,2);
              pfVar22 = (float *)((long)&_kernel->data + lVar15);
              auVar33._0_4_ = auVar34._0_4_ * *pfVar22;
              auVar33._4_4_ = auVar34._4_4_ * pfVar22[1];
              auVar33._8_4_ = auVar34._8_4_ * pfVar22[2];
              auVar33._12_4_ = auVar34._12_4_ * pfVar22[3];
              auVar14._16_4_ = auVar34._16_4_ * pfVar22[4];
              auVar14._0_16_ = auVar33;
              auVar14._20_4_ = auVar34._20_4_ * pfVar22[5];
              auVar14._24_4_ = auVar34._24_4_ * pfVar22[6];
              auVar14._28_4_ = auVar34._28_4_;
              pfVar22 = (float *)(puVar21 + 1);
              auVar32 = vhaddps_avx(auVar14._16_16_,auVar33);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              puVar17 = (ulong *)((long)puVar17 + 4);
              auVar32 = vhaddps_avx(auVar32,auVar32);
              puVar16 = puVar16 + 1;
              puVar21 = (ulong *)((long)puVar21 + 4);
              *pfVar23 = *(float *)((long)&_kernel->allocator + lVar15) * *pfVar22 + fVar29 +
                         auVar32._0_4_;
              pfVar23 = pfVar23 + 1;
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
          }
          puVar17 = puVar17 + 1;
          puVar16 = puVar16 + 2;
          puVar21 = puVar21 + 1;
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar7);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar5);
  }
  return;
}

Assistant:

static void convdw3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;
        float* outptr2 = outptr + outw;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;
        const float* r3 = img0 + w * 3;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i + 1 < outh; i += 2)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                float sum2 = bias0;
                sum2 += r1[0] * k0[0];
                sum2 += r1[1] * k0[1];
                sum2 += r1[2] * k0[2];
                sum2 += r2[0] * k1[0];
                sum2 += r2[1] * k1[1];
                sum2 += r2[2] * k1[2];
                sum2 += r3[0] * k2[0];
                sum2 += r3[1] * k2[1];
                sum2 += r3[2] * k2[2];

                *outptr = sum;
                *outptr2 = sum2;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
                outptr2++;
            }

            r0 += 2 + w;
            r1 += 2 + w;
            r2 += 2 + w;
            r3 += 2 + w;

            outptr += outw;
            outptr2 += outw;
        }

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}